

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O3

int cgltf_parse_json_clearcoat
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,
              cgltf_clearcoat *out_clearcoat)

{
  jsmntok_t *tok;
  int iVar1;
  uint uVar2;
  cgltf_clearcoat *out_texture_view;
  int iVar3;
  cgltf_float cVar4;
  
  if (tokens[(uint)i].type == JSMN_OBJECT) {
    iVar3 = tokens[(uint)i].size;
    uVar2 = i + 1;
    if (0 < iVar3) {
      do {
        iVar3 = iVar3 + -1;
        if ((tokens[uVar2].type != JSMN_STRING) || (tok = tokens + uVar2, tok->size == 0))
        goto LAB_0011764c;
        iVar1 = cgltf_json_strcmp(tok,json_chunk,"clearcoatFactor");
        if (iVar1 == 0) {
          cVar4 = cgltf_json_to_float(tokens + (long)(int)uVar2 + 1,json_chunk);
          out_clearcoat->clearcoat_factor = cVar4;
LAB_001175ef:
          uVar2 = uVar2 + 2;
        }
        else {
          iVar1 = cgltf_json_strcmp(tok,json_chunk,"clearcoatRoughnessFactor");
          if (iVar1 == 0) {
            cVar4 = cgltf_json_to_float(tokens + (long)(int)uVar2 + 1,json_chunk);
            out_clearcoat->clearcoat_roughness_factor = cVar4;
            goto LAB_001175ef;
          }
          iVar1 = cgltf_json_strcmp(tok,json_chunk,"clearcoatTexture");
          out_texture_view = out_clearcoat;
          if ((iVar1 == 0) ||
             (iVar1 = cgltf_json_strcmp(tok,json_chunk,"clearcoatRoughnessTexture"),
             out_texture_view = (cgltf_clearcoat *)&out_clearcoat->clearcoat_roughness_texture,
             iVar1 == 0)) {
LAB_00117630:
            uVar2 = cgltf_parse_json_texture_view
                              (options,tokens,uVar2 + 1,json_chunk,
                               &out_texture_view->clearcoat_texture);
          }
          else {
            iVar1 = cgltf_json_strcmp(tok,json_chunk,"clearcoatNormalTexture");
            out_texture_view = (cgltf_clearcoat *)&out_clearcoat->clearcoat_normal_texture;
            if (iVar1 == 0) goto LAB_00117630;
            uVar2 = cgltf_skip_json(tokens,uVar2 + 1);
          }
        }
      } while ((-1 < (int)uVar2) && (iVar3 != 0));
    }
  }
  else {
LAB_0011764c:
    uVar2 = 0xffffffff;
  }
  return uVar2;
}

Assistant:

static int cgltf_parse_json_clearcoat(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, cgltf_clearcoat* out_clearcoat)
{
	CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);
	int size = tokens[i].size;
	++i;

	for (int j = 0; j < size; ++j)
	{
		CGLTF_CHECK_KEY(tokens[i]);

		if (cgltf_json_strcmp(tokens+i, json_chunk, "clearcoatFactor") == 0)
		{
			++i;
			out_clearcoat->clearcoat_factor = cgltf_json_to_float(tokens + i, json_chunk);
			++i;
		}
		else if (cgltf_json_strcmp(tokens+i, json_chunk, "clearcoatRoughnessFactor") == 0)
		{
			++i;
			out_clearcoat->clearcoat_roughness_factor = cgltf_json_to_float(tokens + i, json_chunk);
			++i;
		}
		else if (cgltf_json_strcmp(tokens+i, json_chunk, "clearcoatTexture") == 0)
		{
			i = cgltf_parse_json_texture_view(options, tokens, i + 1, json_chunk, &out_clearcoat->clearcoat_texture);
		}
		else if (cgltf_json_strcmp(tokens+i, json_chunk, "clearcoatRoughnessTexture") == 0)
		{
			i = cgltf_parse_json_texture_view(options, tokens, i + 1, json_chunk, &out_clearcoat->clearcoat_roughness_texture);
		}
		else if (cgltf_json_strcmp(tokens+i, json_chunk, "clearcoatNormalTexture") == 0)
		{
			i = cgltf_parse_json_texture_view(options, tokens, i + 1, json_chunk, &out_clearcoat->clearcoat_normal_texture);
		}
		else
		{
			i = cgltf_skip_json(tokens, i+1);
		}

		if (i < 0)
		{
			return i;
		}
	}

	return i;
}